

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroidtracker.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
centroidtracker::cdist
          (centroidtracker *this,vector<centroid,_std::allocator<centroid>_> *data_1,
          vector<centroid,_std::allocator<centroid>_> *data_2)

{
  size_type sVar1;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<centroid,_std::allocator<centroid>_> *in_RCX;
  vector<centroid,_std::allocator<centroid>_> *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDI;
  int j;
  vector<double,_std::allocator<double>_> result_row;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *result;
  centroid in_stack_ffffffffffffff48;
  centroid in_stack_ffffffffffffff50;
  const_reference in_stack_ffffffffffffff58;
  undefined4 local_44;
  undefined4 local_28;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x13568b);
  for (local_28 = 0; sVar1 = std::vector<centroid,_std::allocator<centroid>_>::size(in_RDX),
      (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1356c8);
    local_44 = 0;
    while( true ) {
      this_00 = (vector<double,_std::allocator<double>_> *)(long)local_44;
      pvVar2 = (vector<double,_std::allocator<double>_> *)
               std::vector<centroid,_std::allocator<centroid>_>::size(in_RCX);
      if (pvVar2 <= this_00) break;
      in_stack_ffffffffffffff58 =
           std::vector<centroid,_std::allocator<centroid>_>::at
                     ((vector<centroid,_std::allocator<centroid>_> *)in_stack_ffffffffffffff50,
                      (size_type)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 =
           (centroid)
           std::vector<centroid,_std::allocator<centroid>_>::at
                     ((vector<centroid,_std::allocator<centroid>_> *)in_stack_ffffffffffffff50,
                      (size_type)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff48 =
           (centroid)distanceOfPts(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50,
                 (value_type_conflict2 *)in_stack_ffffffffffffff48);
      local_44 = local_44 + 1;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)this_00,(value_type *)in_stack_ffffffffffffff58);
    std::vector<double,_std::allocator<double>_>::~vector(this_00);
  }
  return in_RDI;
}

Assistant:

std::vector<std::vector<double>> centroidtracker::cdist(const std::vector<centroid> data_1, const std::vector<centroid> data_2) {
	std::vector<std::vector<double>> result;
	for (int i = 0; i < data_1.size(); ++i) {
		std::vector<double> result_row;
		for (int j = 0; j < data_2.size(); ++j) {
			result_row.push_back(distanceOfPts(data_1.at(i), data_2.at(j)));
		}
		result.push_back(result_row);
	}
	return result;
}